

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::setLoggingLevel(CommonCore *this,int logLevel)

{
  GlobalBrokerId id;
  BrokerBase *in_RDI;
  ActionMessage cmd;
  undefined4 in_stack_ffffffffffffff08;
  int32_t in_stack_ffffffffffffff0c;
  action_t in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  GlobalFederateId in_stack_ffffffffffffff34;
  
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff34.gid,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c);
  id = CLI::std::atomic<helics::GlobalBrokerId>::load
                 ((atomic<helics::GlobalBrokerId> *)&in_RDI->higher_broker_id,seq_cst);
  GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xffffffffffffff34,id);
  ActionMessage::setExtraData((ActionMessage *)in_RDI,in_stack_ffffffffffffff0c);
  BrokerBase::addActionMessage
            (in_RDI,(ActionMessage *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  ActionMessage::~ActionMessage((ActionMessage *)in_RDI);
  return;
}

Assistant:

void CommonCore::setLoggingLevel(int logLevel)
{
    ActionMessage cmd(CMD_CORE_CONFIGURE);
    cmd.dest_id = global_id.load();
    cmd.messageID = defs::Properties::LOG_LEVEL;
    cmd.setExtraData(logLevel);
    addActionMessage(cmd);
}